

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_t count,
          allocator<int> *alloc)

{
  allocator<int> *in_RDX;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RSI;
  size_type in_stack_00000018;
  
  small_vector(in_RSI,in_RDX);
  resize((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)alloc,in_stack_00000018);
  return;
}

Assistant:

explicit small_vector(size_t count, const Alloc& alloc = Alloc())
        : small_vector(alloc)
    {
        resize(count);
    }